

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall
ON_SubDVertex::ReplaceFaceInArray(ON_SubDVertex *this,ON_SubDFace *old_face,ON_SubDFace *new_face)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar2 = 0xffffffff;
  if (old_face != new_face && old_face != (ON_SubDFace *)0x0) {
    uVar2 = FaceArrayIndex(this,old_face);
  }
  uVar4 = 0xffffffff;
  if (uVar2 != 0xffffffff) {
    if (new_face == (ON_SubDFace *)0x0) {
      uVar1 = this->m_face_count;
      this->m_face_count = uVar1 - 1;
      uVar4 = uVar2 + 1;
      if (uVar4 < uVar1) {
        uVar3 = (ulong)uVar2;
        do {
          this->m_faces[uVar3 & 0xffffffff] = this->m_faces[uVar3 + 1];
          uVar3 = uVar3 + 1;
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
    }
    else {
      this->m_faces[uVar2] = new_face;
      uVar4 = uVar2;
    }
  }
  return uVar4;
}

Assistant:

unsigned int ON_SubDVertex::ReplaceFaceInArray(const ON_SubDFace * old_face, const ON_SubDFace * new_face)
{
  unsigned vfi = (nullptr != old_face && old_face != new_face) ? FaceArrayIndex(old_face) : ON_UNSET_UINT_INDEX;
  if (ON_UNSET_UINT_INDEX == vfi)
    return ON_UNSET_UINT_INDEX;
  if (nullptr != new_face)
  {
    m_faces[vfi] = new_face;
  }
  else
  {
    const unsigned c = (unsigned)(m_face_count--);
    while (++vfi < c)
      m_faces[vfi - 1] = m_faces[vfi];
  }
  return vfi;
}